

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O0

void just::console::text_color(color c_)

{
  bool bVar1;
  color<void> local_c [2];
  color c__local;
  
  local_c[0]._id = c_._id;
  bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::black);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"\x1b[30m");
  }
  else {
    bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::red);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"\x1b[31m");
    }
    else {
      bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::green);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"\x1b[32m");
      }
      else {
        bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::yellow);
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,"\x1b[33m");
        }
        else {
          bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::blue);
          if (bVar1) {
            std::operator<<((ostream *)&std::cout,"\x1b[34m");
          }
          else {
            bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::magenta);
            if (bVar1) {
              std::operator<<((ostream *)&std::cout,"\x1b[35m");
            }
            else {
              bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::cyan);
              if (bVar1) {
                std::operator<<((ostream *)&std::cout,"\x1b[36m");
              }
              else {
                bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::gray);
                if (bVar1) {
                  std::operator<<((ostream *)&std::cout,"\x1b[37m");
                }
                else {
                  bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::bright_red);
                  if (bVar1) {
                    std::operator<<((ostream *)&std::cout,"\x1b[1;31m");
                  }
                  else {
                    bVar1 = impl::color<void>::operator==(local_c,impl::color<void>::bright_green);
                    if (bVar1) {
                      std::operator<<((ostream *)&std::cout,"\x1b[1;32m");
                    }
                    else {
                      bVar1 = impl::color<void>::operator==
                                        (local_c,impl::color<void>::bright_yellow);
                      if (bVar1) {
                        std::operator<<((ostream *)&std::cout,"\x1b[1;33m");
                      }
                      else {
                        bVar1 = impl::color<void>::operator==
                                          (local_c,impl::color<void>::bright_blue);
                        if (bVar1) {
                          std::operator<<((ostream *)&std::cout,"\x1b[1;34m");
                        }
                        else {
                          bVar1 = impl::color<void>::operator==
                                            (local_c,impl::color<void>::bright_magenta);
                          if (bVar1) {
                            std::operator<<((ostream *)&std::cout,"\x1b[1;35m");
                          }
                          else {
                            bVar1 = impl::color<void>::operator==
                                              (local_c,impl::color<void>::bright_cyan);
                            if (bVar1) {
                              std::operator<<((ostream *)&std::cout,"\x1b[1;36m");
                            }
                            else {
                              bVar1 = impl::color<void>::operator==
                                                (local_c,impl::color<void>::white);
                              if (!bVar1) {
                                __assert_fail("!\"Invalid color value\"",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/console.hpp"
                                              ,0xbf,"void just::console::text_color(color)");
                              }
                              std::operator<<((ostream *)&std::cout,"\x1b[1;37m");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void text_color(color c_)
    {
           if (c_ == color::black)          { std::cout << "\033[30m";   }
      else if (c_ == color::red)            { std::cout << "\033[31m";   }
      else if (c_ == color::green)          { std::cout << "\033[32m";   }
      else if (c_ == color::yellow)         { std::cout << "\033[33m";   }
      else if (c_ == color::blue)           { std::cout << "\033[34m";   }
      else if (c_ == color::magenta)        { std::cout << "\033[35m";   }
      else if (c_ == color::cyan)           { std::cout << "\033[36m";   }
      else if (c_ == color::gray)           { std::cout << "\033[37m";   }
      else if (c_ == color::bright_red)     { std::cout << "\033[1;31m"; }
      else if (c_ == color::bright_green)   { std::cout << "\033[1;32m"; }
      else if (c_ == color::bright_yellow)  { std::cout << "\033[1;33m"; }
      else if (c_ == color::bright_blue)    { std::cout << "\033[1;34m"; }
      else if (c_ == color::bright_magenta) { std::cout << "\033[1;35m"; }
      else if (c_ == color::bright_cyan)    { std::cout << "\033[1;36m"; }
      else if (c_ == color::white)          { std::cout << "\033[1;37m"; }
      else { assert(!"Invalid color value"); }
    }